

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solve_algorithms.cpp
# Opt level: O3

ValueRep __thiscall
Clasp::BasicSolve::State::solve(State *this,Solver *s,SolveParams *p,SolveLimits *lim)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint32 uVar5;
  uint uVar6;
  uint64 uVar7;
  ulong uVar8;
  long lVar9;
  DynamicLimit *pDVar10;
  DynamicLimit *pDVar11;
  DynamicLimit *pDVar12;
  uint uVar13;
  uint uVar14;
  DynamicLimit *pDVar15;
  ValueRep VVar16;
  long *plVar17;
  DynamicLimit *pDVar18;
  DynamicLimit *pDVar19;
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  DBInfo DVar23;
  RestartSchedule rs;
  ScheduleStrategy dbGrow;
  WeightLitVec inDegree;
  uint local_134;
  ScheduleStrategy local_128;
  SolveLimits *local_118;
  uint64 local_110;
  ReduceStrategy *local_108;
  uint local_fc;
  ScheduleStrategy local_f8;
  SearchLimits local_e8;
  WeightLitVec local_a8;
  ScheduleStrategy *local_90;
  SearchLimits local_88;
  ScheduleStrategy local_48;
  
  if (s->enum_ == (Constraint *)0x0) {
    uVar6 = 0;
  }
  else {
    uVar6 = (uint)*(byte *)((long)&s->enum_[7]._vptr_Constraint + 5);
  }
  if (((s->conflict_).ebo_.size == 0) || ((s->levels_).super_type.ebo_.size != (s->levels_).root)) {
    if (this->resetState == true) {
      SingleOwnerPtr<Clasp::DynamicLimit,_Clasp::DeleteObject>::reset
                (&this->dynRestart,(DynamicLimit *)0x0);
      SingleOwnerPtr<Clasp::BlockLimit,_Clasp::DeleteObject>::reset
                (&this->rsBlock,(BlockLimit *)0x0);
      State(this,s,p);
    }
    local_a8.ebo_.buf = (pointer)0x0;
    local_a8.ebo_.size = 0;
    local_a8.ebo_.cap = 0;
    SearchLimits::SearchLimits(&local_e8);
    local_128._0_8_ = *(undefined8 *)&(p->restart).rsSched.super_ScheduleStrategy;
    local_128.len = (p->restart).rsSched.super_ScheduleStrategy.len;
    local_128.grow = (p->restart).rsSched.super_ScheduleStrategy.grow;
    local_f8._0_8_ = *(undefined8 *)&(p->reduce).growSched;
    local_f8.len = (p->reduce).growSched.len;
    local_f8.grow = (p->reduce).growSched.grow;
    local_134 = this->dbPinned;
    local_90 = &this->dbRed;
    uVar7 = ScheduleStrategy::current(local_90);
    uVar4 = this->dbRedInit;
    pDVar19 = (DynamicLimit *)this->dbGrowNext;
    pDVar18 = (DynamicLimit *)lim->conflicts;
    local_110 = lim->restarts;
    if ((local_f8._0_8_ & 0x3fffffff) != 0) {
      ScheduleStrategy::advanceTo(&local_f8,this->nGrow);
    }
    uVar5 = this->nRestart;
    if ((uVar5 == 0xffffffff) &&
       ((*(ulong *)&(p->restart).field_0x18 & 0x3000000000000000) == 0x2000000000000000)) {
      SearchLimits::SearchLimits(&local_88);
      local_e8.used =
           CONCAT44(local_88.used._4_4_,CONCAT22(local_88.used._2_2_,(ushort)local_88.used));
      local_e8.memory._0_4_ = (undefined4)local_88.memory;
      local_e8.memory._4_4_ = local_88.memory._4_4_;
      local_e8.learnts = local_88.learnts;
      local_e8.restart.local = local_88.restart.local;
      local_e8.restart._25_7_ = local_88.restart._25_7_;
      local_e8.conflicts._0_4_ = (undefined4)local_88.conflicts;
      local_e8.conflicts._4_4_ = local_88.conflicts._4_4_;
      local_e8.restart.dynamic = local_88.restart.dynamic;
      local_e8.restart.conflicts = local_88.restart.conflicts;
    }
    else if (((uint)local_128._0_4_ < 0xc0000000) ||
            (pDVar15 = (DynamicLimit *)((this->dynRestart).ptr_ & 0xfffffffffffffffe),
            pDVar15 == (DynamicLimit *)0x0)) {
      if ((local_128._0_8_ & 0x3fffffff) == 0) {
        uVar5 = local_128._0_4_ & 0x3fffffff;
      }
      ScheduleStrategy::advanceTo(&local_128,uVar5);
      local_e8.restart.conflicts = ScheduleStrategy::current(&local_128);
    }
    else {
      if (uVar5 == 0) {
        DynamicLimit::resetAdjust
                  (pDVar15,local_128.grow,lbd_limit,-(uint)(local_128.len == 0xffffffff) | 16000,
                   true);
        pDVar15 = (DynamicLimit *)((this->dynRestart).ptr_ & 0xfffffffffffffffe);
      }
      uVar5 = (pDVar15->adjust).limit;
      uVar13 = (pDVar15->adjust).samples;
      uVar14 = uVar5 - 1;
      if (uVar14 < uVar13) {
        uVar13 = uVar14;
      }
      local_e8.restart.conflicts = (uint64)(uVar5 - uVar13);
      local_e8.restart.dynamic = pDVar15;
    }
    local_e8.restart._24_8_ =
         CONCAT71(local_e8.restart._25_7_,
                  (byte)((ulong)*(undefined8 *)&(p->restart).field_0x18 >> 0x3e)) &
         0xffffffffffffff01;
    local_e8.restart.block = (BlockPtr)((this->rsBlock).ptr_ & 0xfffffffffffffffe);
    uVar8 = (ulong)(p->reduce).memMax;
    if (uVar8 != 0) {
      lVar9 = uVar8 << 0x14;
      local_e8.memory._0_4_ = (undefined4)lVar9;
      local_e8.memory._4_4_ = (undefined4)((ulong)lVar9 >> 0x20);
    }
    iVar3 = (Event_t<Clasp::BasicSolveEvent>::id_s & 0xffff) << 0xc;
    local_88.used._0_2_ = (ushort)iVar3 | 0x52f;
    local_88.used._2_2_ = (undefined2)((uint)iVar3 >> 0x10);
    local_118 = lim;
    local_fc = uVar6;
    local_88.restart.conflicts = (uint64)s;
    if (pDVar18 == (DynamicLimit *)0x0) {
      pDVar18 = (DynamicLimit *)0x0;
LAB_0016551b:
      uVar6 = 0;
    }
    else {
      pDVar15 = (DynamicLimit *)(uVar7 + uVar4);
      local_108 = &(p->reduce).strategy;
      do {
        pDVar10 = (DynamicLimit *)
                  (-(ulong)((*(ulong *)&(p->restart).field_0x18 & 0x4000000000000000) != 0) |
                  local_e8.restart.conflicts);
        local_e8.used = 0;
        dVar20 = (double)((int)(p->reduce).strategy >> 0x1f & local_134) + this->dbMax;
        dVar21 = this->dbHigh;
        if (dVar20 <= this->dbHigh) {
          dVar21 = dVar20;
        }
        local_e8.learnts = (uint32)(long)dVar21;
        if (pDVar18 < pDVar10) {
          pDVar10 = pDVar18;
        }
        local_88.restart.dynamic = pDVar15;
        if (pDVar19 < pDVar15) {
          local_88.restart.dynamic = pDVar19;
        }
        if (pDVar10 < local_88.restart.dynamic) {
          local_88.restart.dynamic = pDVar10;
        }
        local_e8.conflicts._0_4_ = SUB84(local_88.restart.dynamic,0);
        local_e8.conflicts._4_4_ = (undefined4)((ulong)local_88.restart.dynamic >> 0x20);
        local_88.restart.block._0_4_ = local_e8.learnts;
        if (((ushort)local_88.used & 0xff0) != 0) {
          SharedContext::report(s->shared_,(Event *)&local_88);
          uVar6 = CONCAT22(local_88.used._2_2_,(ushort)local_88.used) & 0xfffff00f;
          local_88.used._0_2_ = (ushort)uVar6;
          local_88.used._2_2_ = (undefined2)(uVar6 >> 0x10);
        }
        bVar1 = Solver::search(s,&local_e8,(double)p->randProb);
        uVar6 = (uint)bVar1;
        pDVar10 = (DynamicLimit *)local_e8.used;
        if ((DynamicLimit *)CONCAT44(local_e8.conflicts._4_4_,(undefined4)local_e8.conflicts) <
            local_e8.used) {
          pDVar10 = (DynamicLimit *)
                    CONCAT44(local_e8.conflicts._4_4_,(undefined4)local_e8.conflicts);
        }
        pDVar19 = (DynamicLimit *)((long)pDVar19 - (long)pDVar10);
        pDVar18 = (DynamicLimit *)((long)pDVar18 - (long)pDVar10);
        if (bVar1 != 0) {
          uVar4 = CONCAT22(local_88.used._2_2_,(ushort)local_88.used) & 0xfffff00f;
          local_88.used._0_2_ = (ushort)uVar4 | 0x450;
          local_88.used._2_2_ = (undefined2)(uVar4 >> 0x10);
          if (bVar1 == 1) {
            uVar4 = (uint)((ulong)*(undefined8 *)&(p->restart).field_0x18 >> 0x3c) & 3;
            if (uVar4 == 1) {
              uVar5 = 0;
            }
            else {
              if (uVar4 != 2) goto LAB_00165527;
              uVar5 = 0xffffffff;
            }
            this->nRestart = uVar5;
          }
LAB_00165527:
          if ((local_f8._0_8_ & 0x3fffffff) != 0) {
            this->dbGrowNext =
                 (long)&(pDVar19->adjust).limit + (ulong)(pDVar19 == (DynamicLimit *)0x0);
          }
          SharedContext::report(s->shared_,(Event *)&local_88);
          goto LAB_0016554d;
        }
        bVar2 = Solver::restartReached(s,&local_e8);
        if (bVar2) {
          uVar4 = this->nRestart + 1;
          this->nRestart = uVar4;
          uVar6 = *(uint *)&(p->restart).field_0x18;
          uVar14 = uVar6 & 0xffff;
          if ((uVar14 != 0) && (uVar4 % uVar14 == 0)) {
            local_a8.ebo_._8_8_ = local_a8.ebo_._8_8_ & 0xffffffff00000000;
            uVar8 = (s->heuristic_).ptr_;
            uVar5 = Solver::inDegree(s,&local_a8);
            plVar17 = (long *)(uVar8 & 0xfffffffffffffffe);
            (**(code **)(*plVar17 + 0x58))
                      ((double)(uVar6 >> 0x10) / (double)uVar5,plVar17,s,&local_a8);
          }
          if (local_e8.restart.dynamic == (DynamicLimit *)0x0) {
            local_e8.restart.conflicts = ScheduleStrategy::next(&local_128);
            pDVar12 = (DynamicLimit *)local_e8.restart.conflicts;
          }
          else {
            uVar6 = (local_e8.restart.dynamic)->num_;
            uVar5 = DynamicLimit::restart(local_e8.restart.dynamic,local_128.len,local_128.grow);
            local_e8.restart.conflicts = (uint64)uVar5;
            pDVar12 = (DynamicLimit *)(ulong)uVar6;
          }
          Solver::restart(s);
          if (((uint)*local_108 & 0x1fc0000) != 0) {
            DVar23 = Solver::reduceLearnts
                               (s,(float)((uint)*local_108 >> 0x12 & 0x7f) / 100.0,local_108);
            local_134 = DVar23.pinned;
          }
          if (this->nRestart == this->rsShuffle) {
            this->rsShuffle =
                 ((uint)((ulong)*(undefined8 *)&(p->restart).field_0x18 >> 0x2e) & 0x3fff) +
                 this->nRestart;
            s->field_0x207 = s->field_0x207 | 0x40;
          }
          local_110 = local_110 - 1;
          if (local_110 == 0) {
            local_110 = 0;
            goto LAB_0016551b;
          }
          (s->stats).super_CoreStats.lastRestart = (s->stats).super_CoreStats.analyzed;
          uVar6 = CONCAT22(local_88.used._2_2_,(ushort)local_88.used) & 0xfffff00f;
          local_88.used._0_2_ = (ushort)uVar6 | 0x520;
          local_88.used._2_2_ = (undefined2)(uVar6 >> 0x10);
        }
        else {
          pDVar12 = pDVar10;
          if ((*(ulong *)&(p->restart).field_0x18 & 0x4000000000000000) == 0) {
            bVar2 = pDVar10 <= local_e8.restart.conflicts;
            pDVar11 = (DynamicLimit *)(local_e8.restart.conflicts - (long)pDVar10);
            local_e8.restart.conflicts = (uint64)(DynamicLimit *)0x0;
            if (bVar2) {
              local_e8.restart.conflicts = (uint64)pDVar11;
            }
          }
        }
        pDVar15 = (DynamicLimit *)((long)pDVar15 - (long)pDVar10);
        if ((pDVar15 == (DynamicLimit *)0x0) || (bVar2 = Solver::reduceReached(s,&local_e8), bVar2))
        {
          DVar23 = Solver::reduceLearnts
                             (s,(float)((uint)*local_108 >> 0xb & 0x7f) / 100.0,local_108);
          local_134 = DVar23.pinned;
          uVar6 = this->dbRedInit;
          if (pDVar15 == (DynamicLimit *)0x0) {
            uVar7 = ScheduleStrategy::next(local_90);
          }
          else {
            uVar7 = ScheduleStrategy::current(local_90);
          }
          uVar4 = ((ushort)local_88.used & 0xff0) >> 4;
          if (uVar4 < 0x45) {
            uVar4 = 0x44;
          }
          uVar14 = CONCAT22(local_88.used._2_2_,(ushort)local_88.used) & 0xfffff00f;
          local_88.used._0_2_ = (ushort)uVar14 | (ushort)(uVar4 << 4);
          local_88.used._2_2_ = (undefined2)(uVar14 >> 0x10);
          bVar2 = Solver::reduceReached(s,&local_e8);
          pDVar15 = (DynamicLimit *)(uVar7 + uVar6);
          if ((bVar2) || (this->dbMax <= (double)local_134)) {
            local_48._0_4_ = 0x14025800;
            DVar23 = Solver::reduceLearnts(s,0.5,(ReduceStrategy *)&local_48);
            if (local_e8.learnts <= DVar23.size) {
              dVar21 = (double)(s->learnts_).ebo_.size / 10.0;
              if (dVar21 <= 100.0) {
                dVar21 = 100.0;
              }
              dVar21 = dVar21 + this->dbMax;
              dVar20 = this->dbHigh;
              if (dVar21 <= this->dbHigh) {
                dVar20 = dVar21;
              }
              this->dbMax = dVar20;
            }
            local_134 = local_134 >> 1;
          }
        }
        if (pDVar19 == (DynamicLimit *)0x0) {
          pDVar12 = (DynamicLimit *)ScheduleStrategy::next(&local_f8);
          this->nGrow = this->nGrow + 1;
          pDVar19 = pDVar12;
LAB_001653ed:
          lVar9 = (long)&(pDVar12->adjust).limit + (ulong)(s->learnts_).ebo_.size;
          auVar22._8_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar22._0_8_ = lVar9;
          auVar22._12_4_ = 0x45300000;
          dVar21 = this->dbMax;
          if (dVar21 < (auVar22._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) {
            dVar21 = dVar21 * (double)(p->reduce).fGrow;
            this->dbMax = dVar21;
            uVar6 = ((ushort)local_88.used & 0xff0) >> 4;
            if (uVar6 < 0x48) {
              uVar6 = 0x47;
            }
            uVar4 = CONCAT22(local_88.used._2_2_,(ushort)local_88.used) & 0xfffff00f;
            local_88.used._0_2_ = (ushort)uVar4 | (ushort)(uVar6 << 4);
            local_88.used._2_2_ = (undefined2)(uVar4 >> 0x10);
          }
          if (this->dbHigh < dVar21) {
            this->dbMax = this->dbHigh;
            ScheduleStrategy::ScheduleStrategy(&local_48,Geometric,0,1.5,0);
            local_f8._0_8_ = CONCAT44(local_48.idx,local_48._0_4_);
            local_f8.len = local_48.len;
            local_f8.grow = local_48.grow;
            pDVar19 = (DynamicLimit *)0xffffffffffffffff;
          }
        }
        else if ((local_f8._0_4_ == 0x40000000) && (((ushort)local_88.used & 0xff0) == 0x520))
        goto LAB_001653ed;
      } while (pDVar18 != (DynamicLimit *)0x0);
      pDVar18 = (DynamicLimit *)0x0;
      uVar6 = 0;
    }
LAB_0016554d:
    VVar16 = (ValueRep)uVar6;
    this->dbPinned = local_134;
    this->resetState = (local_fc & uVar6) != 0;
    (s->stats).super_CoreStats.lastRestart =
         (s->stats).super_CoreStats.analyzed - (s->stats).super_CoreStats.lastRestart;
    if ((local_118->conflicts & local_118->restarts) != 0xffffffffffffffff) {
      if (local_118->conflicts != 0xffffffffffffffff) {
        local_118->conflicts = (uint64)pDVar18;
      }
      if (local_118->restarts != 0xffffffffffffffff) {
        local_118->restarts = local_110;
      }
    }
    if (local_a8.ebo_.buf != (pointer)0x0) {
      operator_delete(local_a8.ebo_.buf);
    }
  }
  else {
    this->resetState = (bool)(this->resetState | (byte)((uVar6 & 2) >> 1));
    VVar16 = '\x02';
  }
  return VVar16;
}

Assistant:

ValueRep BasicSolve::State::solve(Solver& s, const SolveParams& p, SolveLimits& lim) {
	assert(!lim.reached());
	const uint32 resetMode = s.enumerationConstraint() ? static_cast<const EnumerationConstraint*>(s.enumerationConstraint())->resetMode() : 0u;
	if (s.hasConflict() && s.decisionLevel() == s.rootLevel()) {
		resetState = resetState || (resetMode & value_false) != 0;
		return value_false;
	}
	struct ConflictLimits {
		uint64 reduce;  // current reduce limit
		uint64 grow;    // current limit for next growth operation
		uint64 restart; // current restart limit
		uint64 global;  // current global limit
		uint64 min()      const { return std::min(std::min(reduce, grow), std::min(restart, global)); }
		void  update(uint64 x)  { reduce -= x; grow -= x; restart -= x; global -= x; }
	};
	if (resetState) {
		this->~State();
		new (this) State(s, p);
	}
	WeightLitVec inDegree;
	SearchLimits     sLimit;
	RestartSchedule  rs     = p.restart.rsSched;
	ScheduleStrategy dbGrow = p.reduce.growSched;
	Solver::DBInfo   db     = {0,0,dbPinned};
	ValueRep         result = value_free;
	ConflictLimits   cLimit = {dbRed.current() + dbRedInit, dbGrowNext, UINT64_MAX, lim.conflicts};
	uint64      limRestarts = lim.restarts;
	if (!dbGrow.disabled())  { dbGrow.advanceTo(nGrow); }
	if (nRestart == UINT32_MAX && p.restart.update() == RestartParams::seq_disable) {
		sLimit = SearchLimits();
	}
	else if (rs.isDynamic() && dynRestart.get()) {
		if (!nRestart) dynRestart->resetAdjust(rs.k(), DynamicLimit::lbd_limit, rs.adjustLim(), true);
		sLimit.restart.dynamic   = dynRestart.get();
		sLimit.restart.conflicts = dynRestart->adjust.limit - std::min(dynRestart->adjust.samples, dynRestart->adjust.limit - 1);
	}
	else {
		rs.advanceTo(!rs.disabled() ? nRestart : 0);
		sLimit.restart.conflicts = rs.current();
	}
	sLimit.restart.local = p.restart.local();
	sLimit.restart.block = rsBlock.get();
	if (p.reduce.memMax) {
		sLimit.memory = static_cast<uint64>(p.reduce.memMax)<<20;
	}
	uint64 n = 0;
	for (EventType progress(s, EventType::event_restart, 0, 0); cLimit.global; ) {
		cLimit.restart   = !p.restart.local() ? sLimit.restart.conflicts : UINT64_MAX;
		sLimit.used      = 0;
		sLimit.learnts   = (uint32)std::min(dbMax + (db.pinned*p.reduce.strategy.noGlue), dbHigh);
		sLimit.conflicts = cLimit.min(); assert(sLimit.conflicts);
		progress.cLimit  = sLimit.conflicts;
		progress.lLimit  = sLimit.learnts;
		if (progress.op) { s.sharedContext()->report(progress); progress.op = (uint32)EventType::event_none; }
		result = s.search(sLimit, p.randProb);
		cLimit.update(n = std::min(sLimit.used, sLimit.conflicts)); // number of conflicts in this iteration
		if (result != value_free) {
			progress.op = static_cast<uint32>(EventType::event_exit);
			if (result == value_true && p.restart.update() != RestartParams::seq_continue) {
				if      (p.restart.update() == RestartParams::seq_repeat) { nRestart = 0; }
				else if (p.restart.update() == RestartParams::seq_disable){ nRestart = UINT32_MAX; }
			}
			if (!dbGrow.disabled()) { dbGrowNext = std::max(cLimit.grow, uint64(1)); }
			s.sharedContext()->report(progress);
			break;
		}
		if (s.restartReached(sLimit)) {
			// restart reached - do restart
			++nRestart;
			if (p.restart.counterRestart && (nRestart % p.restart.counterRestart) == 0 ) {
				inDegree.clear();
				s.heuristic()->bump(s, inDegree, p.restart.counterBump / (double)s.inDegree(inDegree));
			}
			if (sLimit.restart.dynamic) {
				n = sLimit.restart.dynamic->runLen();
				sLimit.restart.conflicts = sLimit.restart.dynamic->restart(rs.lbdLim(), rs.k());
			}
			else {
				sLimit.restart.conflicts = n = rs.next();
			}
			s.restart();
			if (p.reduce.strategy.fRestart){ db        = s.reduceLearnts(p.reduce.fRestart(), p.reduce.strategy); }
			if (nRestart == rsShuffle)     { rsShuffle+= p.restart.shuffleNext; s.shuffleOnNextSimplify();}
			if (--limRestarts == 0)        { break; }
			s.stats.lastRestart = s.stats.analyzed;
			progress.op         = (uint32)EventType::event_restart;
		}
		else if (!p.restart.local()) {
			sLimit.restart.conflicts -= std::min(n, sLimit.restart.conflicts);
		}
		if (cLimit.reduce == 0 || s.reduceReached(sLimit)) {
			// reduction reached - remove learnt constraints
			db              = s.reduceLearnts(p.reduce.fReduce(), p.reduce.strategy);
			cLimit.reduce   = dbRedInit + (cLimit.reduce == 0 ? dbRed.next() : dbRed.current());
			progress.op     = std::max(progress.op, (uint32)EventType::event_deletion);
			if (s.reduceReached(sLimit) || db.pinned >= dbMax) {
				ReduceStrategy t; t.algo = 2; t.score = 2; t.glue = 0;
				db.pinned /= 2;
				db.size    = s.reduceLearnts(0.5f, t).size;
				if (db.size >= sLimit.learnts) { dbMax = std::min(dbMax + std::max(100.0, s.numLearntConstraints()/10.0), dbHigh); }
			}
		}
		if (cLimit.grow == 0 || (dbGrow.defaulted() && progress.op == (uint32)EventType::event_restart)) {
			// grow sched reached - increase max db size
			if (cLimit.grow == 0)                      { cLimit.grow = n = dbGrow.next(); ++nGrow; }
			if ((s.numLearntConstraints() + n) > dbMax){ dbMax  *= p.reduce.fGrow; progress.op = std::max(progress.op, (uint32)EventType::event_grow); }
			if (dbMax > dbHigh)                        { dbMax   = dbHigh; cLimit.grow = UINT64_MAX; dbGrow = ScheduleStrategy::none(); }
		}
	}
	dbPinned            = db.pinned;
	resetState          = (resetMode & result) != 0u;
	s.stats.lastRestart = s.stats.analyzed - s.stats.lastRestart;
	if (lim.enabled()) {
		if (lim.conflicts != UINT64_MAX) { lim.conflicts = cLimit.global; }
		if (lim.restarts  != UINT64_MAX) { lim.restarts  = limRestarts;   }
	}
	return result;
}